

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

bool __thiscall spirv_cross::Compiler::variable_storage_is_aliased(Compiler *this,SPIRVariable *v)

{
  BaseType BVar1;
  StorageClass SVar2;
  bool bVar3;
  SPIRType *pSVar4;
  mapped_type *pmVar5;
  bool bVar6;
  bool bVar7;
  byte bVar8;
  Bitset local_70;
  
  pSVar4 = Variant::get<spirv_cross::SPIRType>
                     ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                      *(uint *)&(v->super_IVariant).field_0xc);
  bVar8 = 1;
  if (v->storage != StorageBuffer) {
    pmVar5 = ::std::__detail::
             _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&(this->ir).meta,&(pSVar4->super_IVariant).self);
    bVar8 = ((byte)(pmVar5->decoration).decoration_flags.lower & 8) >> 3;
  }
  BVar1 = pSVar4->basetype;
  SVar2 = pSVar4->storage;
  if (bVar8 == 0) {
    bVar7 = ParsedIR::has_decoration(&this->ir,(ID)(v->super_IVariant).self.id,DecorationRestrict);
  }
  else {
    ParsedIR::get_buffer_block_flags(&local_70,&this->ir,v);
    bVar7 = (bool)((byte)((uint)local_70.lower >> 0x13) & 1);
    ::std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_70.higher._M_h);
  }
  bVar6 = (bool)(bVar7 ^ 1);
  bVar3 = BVar1 == AtomicCounter || SVar2 == PhysicalStorageBuffer;
  if (BVar1 == Image) {
    bVar3 = bVar6;
  }
  if (bVar7 != false) {
    bVar3 = bVar6;
  }
  if (bVar8 != 0) {
    bVar3 = bVar6;
  }
  return bVar3;
}

Assistant:

bool Compiler::variable_storage_is_aliased(const SPIRVariable &v)
{
	auto &type = get<SPIRType>(v.basetype);
	bool ssbo = v.storage == StorageClassStorageBuffer ||
	            ir.meta[type.self].decoration.decoration_flags.get(DecorationBufferBlock);
	bool image = type.basetype == SPIRType::Image;
	bool counter = type.basetype == SPIRType::AtomicCounter;
	bool buffer_reference = type.storage == StorageClassPhysicalStorageBufferEXT;

	bool is_restrict;
	if (ssbo)
		is_restrict = ir.get_buffer_block_flags(v).get(DecorationRestrict);
	else
		is_restrict = has_decoration(v.self, DecorationRestrict);

	return !is_restrict && (ssbo || image || counter || buffer_reference);
}